

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

void __thiscall
ON_HistoryRecord::RemapObjectIds(ON_HistoryRecord *this,ON_SimpleArray<ON_UuidPair> *id_remap)

{
  undefined8 *puVar1;
  ON_UUID *pOVar2;
  VALUE_TYPE VVar3;
  ON_Value *pOVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int k;
  long lVar9;
  long lVar10;
  
  if (0 < id_remap->m_count) {
    ON_UuidList::RemapUuids(&this->m_antecedents,id_remap);
    ON_UuidList::RemapUuids(&this->m_descendants,id_remap);
    for (lVar7 = 0; lVar7 < (this->m_value).m_count; lVar7 = lVar7 + 1) {
      pOVar4 = (this->m_value).m_a[lVar7];
      if (pOVar4 != (ON_Value *)0x0) {
        VVar3 = pOVar4->m_value_type;
        if (VVar3 == objref_value) {
          lVar8 = 0;
          for (lVar9 = 0; lVar9 < *(int *)&pOVar4[2]._vptr_ON_Value; lVar9 = lVar9 + 1) {
            ON_ObjRef::RemapObjectId((ON_ObjRef *)(*(long *)&pOVar4[1].m_value_id + lVar8),id_remap)
            ;
            lVar8 = lVar8 + 0xe0;
          }
        }
        else if (VVar3 == uuid_value) {
          lVar8 = 0;
          for (lVar9 = 0; lVar9 < *(int *)&pOVar4[2]._vptr_ON_Value; lVar9 = lVar9 + 1) {
            uVar6 = ON_SimpleArray<ON_UuidPair>::BinarySearch
                              (id_remap,(ON_UuidPair *)(*(long *)&pOVar4[1].m_value_id + lVar8),
                               ON_UuidPair::CompareFirstUuid);
            if (-1 < (int)uVar6) {
              pOVar2 = id_remap->m_a[uVar6].m_uuid + 1;
              uVar5 = *(undefined8 *)pOVar2->Data4;
              puVar1 = (undefined8 *)(*(long *)&pOVar4[1].m_value_id + lVar8);
              *puVar1 = *(undefined8 *)pOVar2;
              puVar1[1] = uVar5;
            }
            lVar8 = lVar8 + 0x10;
          }
        }
        else if (VVar3 == polyedge_value) {
          for (lVar8 = 0; lVar8 < *(int *)&pOVar4[2]._vptr_ON_Value; lVar8 = lVar8 + 1) {
            lVar10 = 0;
            for (lVar9 = 0; lVar9 < *(int *)(*(long *)&pOVar4[1].m_value_id + 0x10 + lVar8 * 0x78);
                lVar9 = lVar9 + 1) {
              ON_ObjRef::RemapObjectId
                        ((ON_ObjRef *)
                         (*(long *)(*(long *)&pOVar4[1].m_value_id + lVar8 * 0x78 + 8) + lVar10),
                         id_remap);
              lVar10 = lVar10 + 0x158;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ON_HistoryRecord::RemapObjectIds( const ON_SimpleArray<ON_UuidPair>& id_remap )
{
  if ( id_remap.Count() > 0 )
  {
    int i, j;
    m_antecedents.RemapUuids(id_remap);
    m_descendants.RemapUuids(id_remap);
    for ( i = 0; i < m_value.Count(); i++ )
    {
      ON_Value* v = m_value[i];
      if ( v && ON_Value::objref_value == v->m_value_type )
      {
        ON_ObjRefValue* objrev_v = static_cast<ON_ObjRefValue*>(v);
        for ( j = 0; j < objrev_v->m_value.Count(); j++ )
        {
          objrev_v->m_value[j].RemapObjectId(id_remap);
        }
      }
      // 24 May 2021, Mikko, RH-56171:
      // Some commands like Offset use an UUID list to map inputs and outputs.
      // Similar to remapping the objref ids, the uuid lists also need to be
      // updated to use new ids.
      // Other commands that currently use UUID lists are Divide, Slab, Ribbon, 
      // FilletSrf, ChamferSrf, ArrayCrv, Hatch.
      else if (v && ON_Value::uuid_value == v->m_value_type)
      {
        ON_UuidValue* uuid_v = static_cast<ON_UuidValue*>(v);
        for (j = 0; j < uuid_v->m_value.Count(); j++)
        {
          int index = id_remap.BinarySearch((const ON_UuidPair*)&uuid_v->m_value[j], ON_UuidPair::CompareFirstUuid);
          if (index >= 0)
            uuid_v->m_value[j] = id_remap[index].m_uuid[1];
        }
      }
      // 27 Oct 2021, Mikko, RH-66102:
      // Polyedge values contain objrefs and also need remapping.
      // This fixes history replay not working properly on BlendSrf and others
      // when importing/pasting.
      else if (v && ON_Value::polyedge_value == v->m_value_type)
      {
        ON_PolyEdgeHistoryValue* objrev_v = static_cast<ON_PolyEdgeHistoryValue*>(v);
        for (j = 0; j < objrev_v->m_value.Count(); j++)
        {
          int k;
          for (k = 0; k < objrev_v->m_value[j].m_segment.Count(); k++)
          {
            objrev_v->m_value[j].m_segment[k].m_curve_ref.RemapObjectId(id_remap);
          }
        }
      }
    }
  }
}